

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Namco.cpp
# Opt level: O0

void __thiscall Nes_Namco::reset(Nes_Namco *this)

{
  Namco_Osc *pNVar1;
  Namco_Osc *osc;
  int i;
  Nes_Namco *this_local;
  
  this->addr_reg = 0;
  for (i = 0; i < 0x80; i = i + 1) {
    this->reg[i] = '\0';
  }
  for (i = 0; i < 8; i = i + 1) {
    pNVar1 = this->oscs + i;
    pNVar1->delay = 0;
    pNVar1->last_amp = 0;
    pNVar1->wave_pos = 0;
  }
  return;
}

Assistant:

void Nes_Namco::reset()
{
	addr_reg = 0;
	
	int i;
	for ( i = 0; i < reg_count; i++ )
		reg [i] = 0;
	
	for ( i = 0; i < osc_count; i++ )
	{
		Namco_Osc& osc = oscs [i];
		osc.delay = 0;
		osc.last_amp = 0;
		osc.wave_pos = 0;
	}
}